

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O0

string * __thiscall
svg::Color::toString_abi_cxx11_(string *__return_storage_ptr__,Color *this,Layout *param_1)

{
  ostream *poVar1;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Layout *local_20;
  Layout *param_1_local;
  Color *this_local;
  
  local_20 = param_1;
  param_1_local = (Layout *)this;
  this_local = (Color *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  if ((this->transparent & 1U) == 0) {
    poVar1 = std::operator<<(local_198,"rgb(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->red);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->green);
    poVar1 = std::operator<<(poVar1,",");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->blue);
    std::operator<<(poVar1,")");
  }
  else {
    std::operator<<(local_198,"none");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const &) const
        {
            std::stringstream ss;
            if (transparent)
                ss << "none";
            else
                ss << "rgb(" << red << "," << green << "," << blue << ")";
            return ss.str();
        }